

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O2

char * __thiscall
sentencepiece::SentencePieceText::_InternalParse
          (SentencePieceText *this,char *ptr,ParseContext *ctx)

{
  uint uVar1;
  uint tag_00;
  bool bVar2;
  string *s;
  SentencePieceText_SentencePiece *msg;
  uint uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  char cVar4;
  uint32 tag;
  float *local_50;
  InternalMetadata *local_48;
  uint local_3c;
  ExtensionSet *local_38;
  
  local_48 = &(this->super_MessageLite)._internal_metadata_;
  local_38 = &this->_extensions_;
  uVar3 = 0;
  local_50 = (float *)ptr;
LAB_0021cd90:
  do {
    bVar2 = google::protobuf::internal::ParseContext::Done(ctx,(char **)&local_50);
    if (bVar2) goto LAB_0021cf00;
    local_50 = (float *)google::protobuf::internal::ReadTag((char *)local_50,&local_3c,0);
    tag_00 = local_3c;
    if (local_50 == (float *)0x0) goto LAB_0021cf1b;
    uVar1 = local_3c >> 3;
    cVar4 = (char)local_3c;
    if (uVar1 == 3) {
      if (cVar4 == '\x1d') {
        uVar3 = 2;
        this->score_ = *local_50;
        local_50 = local_50 + 1;
        goto LAB_0021cd90;
      }
LAB_0021ce71:
      if (((ulong)local_3c == 0) || ((local_3c & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
        goto LAB_0021cf00;
      }
      if (local_3c < 0x640) {
        if (((ulong)local_48->ptr_ & 1) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(local_48);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (((ulong)local_48->ptr_ & 0xfffffffffffffffe) + 8);
        }
        local_50 = (float *)google::protobuf::internal::UnknownFieldParse
                                      (tag_00,unknown,(char *)local_50,ctx);
      }
      else {
        local_50 = (float *)google::protobuf::internal::ExtensionSet::ParseField
                                      (local_38,(ulong)local_3c,(char *)local_50,
                                       (MessageLite *)_SentencePieceText_default_instance_,local_48,
                                       ctx);
      }
    }
    else {
      if (uVar1 == 2) {
        if (cVar4 != '\x12') goto LAB_0021ce71;
        local_50 = (float *)((long)local_50 + -1);
        do {
          local_50 = (float *)((long)local_50 + 1);
          msg = google::protobuf::RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece>::
                Add(&this->pieces_);
          local_50 = (float *)google::protobuf::internal::ParseContext::
                              ParseMessage<sentencepiece::SentencePieceText_SentencePiece>
                                        (ctx,msg,(char *)local_50);
          if (local_50 == (float *)0x0) goto LAB_0021cf1b;
        } while ((local_50 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (*(char *)local_50 == '\x12'));
        goto LAB_0021cd90;
      }
      if ((uVar1 != 1) || (cVar4 != '\n')) goto LAB_0021ce71;
      s = _internal_mutable_text_abi_cxx11_(this);
      local_50 = (float *)google::protobuf::internal::InlineGreedyStringParser
                                    (s,(char *)local_50,ctx);
    }
    if (local_50 == (float *)0x0) {
LAB_0021cf1b:
      local_50 = (float *)0x0;
LAB_0021cf00:
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar3;
      return (char *)local_50;
    }
  } while( true );
}

Assistant:

const char* SentencePieceText::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string text = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_text();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .sentencepiece.SentencePieceText.SentencePiece pieces = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_pieces(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // optional float score = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 29)) {
          _Internal::set_has_score(&has_bits);
          score_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((1600u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<std::string>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}